

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::renderTestPattern
          (PointRenderCase *this,IterationConfig *config)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  TestError *this_01;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  undefined8 uVar8;
  MessageBuilder local_338;
  MessageBuilder local_1b8;
  float local_28;
  int local_24;
  GLfloat tessLevel;
  GLint tessLevelPos;
  Functions *gl;
  IterationConfig *config_local;
  PointRenderCase *this_local;
  
  gl = (Functions *)config;
  config_local = (IterationConfig *)this;
  pRVar5 = gles31::Context::getRenderContext((this->super_BBoxRenderCase).super_TestCase.m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  _tessLevel = CONCAT44(extraout_var,iVar2);
  BBoxRenderCase::setupRender(&this->super_BBoxRenderCase,(IterationConfig *)gl);
  if (((this->super_BBoxRenderCase).m_hasTessellationStage & 1U) != 0) {
    pcVar1 = *(code **)(_tessLevel + 0xb48);
    this_00 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
              operator->(&(this->super_BBoxRenderCase).m_program.
                          super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                        );
    dVar3 = glu::ShaderProgram::getProgram(this_00);
    local_24 = (*pcVar1)(dVar3,"u_tessellationLevel");
    local_28 = 0.8;
    do {
      dVar4 = ::deGetFalse();
      if ((dVar4 != 0) || (local_24 == -1)) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"tessLevelPos != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                   ,0xaf1);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_1b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [23])"u_tessellationLevel = ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_28);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    (**(code **)(_tessLevel + 0x14e0))(0x3f4ccccd,local_24);
    (**(code **)(_tessLevel + 0xfd8))(0x8e72,1);
    dVar3 = (**(code **)(_tessLevel + 0x800))();
    glu::checkError(dVar3,"patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xaf7);
  }
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_338,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_338,(char (*) [19])"Rendering pattern.");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  (**(code **)(_tessLevel + 0x5e0))(0xbe2);
  (**(code **)(_tessLevel + 0x120))(1);
  (**(code **)(_tessLevel + 0x100))(0x8006);
  uVar8 = 0;
  if (((this->super_BBoxRenderCase).m_hasTessellationStage & 1U) != 0) {
    uVar8 = 0xe;
  }
  (**(code **)(_tessLevel + 0x538))
            (uVar8,0,*(int *)&(this->super_BBoxRenderCase).field_0xd4 *
                     *(int *)&(this->super_BBoxRenderCase).field_0xd4 * 2);
  dVar3 = (**(code **)(_tessLevel + 0x800))();
  glu::checkError(dVar3,"draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xb01);
  return;
}

Assistant:

void PointRenderCase::renderTestPattern (const IterationConfig& config)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	setupRender(config);

	if (m_hasTessellationStage)
	{
		const glw::GLint	tessLevelPos	= gl.getUniformLocation(m_program->getProgram(), "u_tessellationLevel");
		const glw::GLfloat	tessLevel		= 0.8f; // will be rounded up

		TCU_CHECK(tessLevelPos != -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "u_tessellationLevel = " << tessLevel << tcu::TestLog::EndMessage;

		gl.uniform1f(tessLevelPos, tessLevel);
		gl.patchParameteri(GL_PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "patch param");
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering pattern." << tcu::TestLog::EndMessage;

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_ONE, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);

	gl.drawArrays((m_hasTessellationStage) ? (GL_PATCHES) : (GL_POINTS), 0, m_numStripes * m_numStripes * 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "draw");
}